

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O3

int __thiscall UdpBitDht::recvPkt(UdpBitDht *this,void *data,int size,sockaddr_in *from)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->dhtMtx);
  iVar1 = bdNodeManager::isBitDhtPacket(this->mBitDhtManager,(char *)data,size,from);
  if (iVar1 != 0) {
    this->mReadBytes = this->mReadBytes + size;
    bdNode::incomingMsg(&this->mBitDhtManager->super_bdNode,from,(char *)data,size);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dhtMtx);
  return (uint)(iVar1 != 0);
}

Assistant:

int UdpBitDht::recvPkt(void *data, int size, struct sockaddr_in &from) {
	/* pass onto bitdht */
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	/* check packet suitability */
	if (mBitDhtManager->isBitDhtPacket((char *) data, size, from)) {

		mReadBytes += size;
		mBitDhtManager->incomingMsg(&from, (char *) data, size);
		return 1;
	}
	return 0;
}